

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void kj::ArrayDisposer::Dispose_<kj::_::Delimited<kj::ArrayPtr<int>_>_>::destruct(void *ptr)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *(long *)((long)ptr + 0x20);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)((long)ptr + 0x28);
    *(undefined8 *)((long)ptr + 0x20) = 0;
    *(undefined8 *)((long)ptr + 0x28) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x30))
              (*(undefined8 **)((long)ptr + 0x30),lVar1,0x18,uVar2,uVar2,0);
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }